

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::DefineCachedFunctions(ByteCodeGenerator *this,FuncInfo *funcInfoParent)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  code *pcVar1;
  FuncInfo *pFVar2;
  bool bVar3;
  BOOL BVar4;
  ParseNodeFnc *pPVar5;
  undefined4 *puVar6;
  FunctionBody *this_01;
  ParseNodeFnc *pPVar7;
  uint byteCount;
  ulong uVar8;
  AuxArray<unsigned_int> *local_78;
  AuxArray<unsigned_int> *slotIdInCachedScopeToNestedIndexArray;
  FuncInfo *funcInfoParent_local;
  AuxArray<Js::FuncInfoEntry> *local_60;
  FuncInfoArray *info;
  AuxArray<Js::FuncInfoEntry> *local_50;
  AuxArray<Js::FuncInfoEntry> *local_48;
  anon_class_8_1_3fcf6586 local_40;
  AuxArray<Js::FuncInfoEntry> local_34 [2];
  uint slotCount;
  
  pPVar7 = funcInfoParent->root;
  local_40.fn = (anon_class_24_3_523878ff *)local_34;
  local_34[0].count = 0;
  slotIdInCachedScopeToNestedIndexArray = (AuxArray<unsigned_int> *)funcInfoParent;
  pPVar5 = ParseNode::AsParseNodeFnc(&pPVar7->super_ParseNode);
  info = (FuncInfoArray *)&local_40;
  MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1051:26)>
  ::anon_class_8_1_3fcf6586::operator()
            ((anon_class_8_1_3fcf6586 *)&info,pPVar5->pnodeScopes->pnodeScopes);
  if (pPVar5->pnodeBodyScope != (ParseNodeBlock *)0x0) {
    MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1051:26)>
    ::anon_class_8_1_3fcf6586::operator()
              ((anon_class_8_1_3fcf6586 *)&info,pPVar5->pnodeBodyScope->pnodeScopes);
  }
  uVar8 = (ulong)local_34[0].count;
  if (uVar8 != 0) {
    if (0xfffffff < local_34[0].count) {
      Js::Throw::OutOfMemory();
    }
    this_00 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
    ;
    funcInfoParent_local = (FuncInfo *)this;
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_007fee82;
      *puVar6 = 0;
    }
    uVar8 = uVar8 << 3;
    local_60 = (AuxArray<Js::FuncInfoEntry> *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocInternal(this_00,uVar8 | 4);
    if (local_60 == (AuxArray<Js::FuncInfoEntry> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x20d,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_007fee82:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    local_60->count = local_34[0].count;
    this_01 = FuncInfo::GetParsedFunctionBody(funcInfoParent);
    local_78 = Js::FunctionBody::AllocateSlotIdInCachedScopeToNestedIndexArray
                         (this_01,local_34[0].count);
    local_48 = (AuxArray<Js::FuncInfoEntry> *)&local_78;
    local_34[0].count = 0;
    info = (FuncInfoArray *)&local_60;
    local_50 = local_34;
    pPVar5 = ParseNode::AsParseNodeFnc(&pPVar7->super_ParseNode);
    local_40.fn = (anon_class_24_3_523878ff *)&info;
    MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1080:24)>
    ::anon_class_8_1_3fcf6586::operator()(&local_40,pPVar5->pnodeScopes->pnodeScopes);
    if (pPVar5->pnodeBodyScope != (ParseNodeBlock *)0x0) {
      MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1080:24)>
      ::anon_class_8_1_3fcf6586::operator()(&local_40,pPVar5->pnodeBodyScope->pnodeScopes);
    }
    pFVar2 = funcInfoParent_local;
    byteCount = (uint)uVar8 | 4;
    Js::ByteCodeWriter::AuxNoReg
              ((ByteCodeWriter *)&funcInfoParent_local->varRegsCount,InitCachedFuncs,local_60,
               byteCount,byteCount);
    local_34[0].count = 0;
    info = (FuncInfoArray *)pFVar2;
    local_50 = (AuxArray<Js::FuncInfoEntry> *)&slotIdInCachedScopeToNestedIndexArray;
    local_48 = local_34;
    pPVar7 = ParseNode::AsParseNodeFnc(&pPVar7->super_ParseNode);
    local_40.fn = (anon_class_24_3_523878ff *)&info;
    MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1102:34)>
    ::anon_class_8_1_3fcf6586::operator()
              ((anon_class_8_1_3fcf6586 *)&local_40,pPVar7->pnodeScopes->pnodeScopes);
    if (pPVar7->pnodeBodyScope != (ParseNodeBlock *)0x0) {
      MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1102:34)>
      ::anon_class_8_1_3fcf6586::operator()
                ((anon_class_8_1_3fcf6586 *)&local_40,pPVar7->pnodeBodyScope->pnodeScopes);
    }
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<Js::FuncInfoEntry>>
              (*(AllocatorType **)&pFVar2->rootObjectLoadMethodInlineCacheCount,local_60,uVar8);
  }
  return;
}

Assistant:

void ByteCodeGenerator::DefineCachedFunctions(FuncInfo *funcInfoParent)
{
    ParseNode *pnodeParent = funcInfoParent->root;
    uint slotCount = 0;

    auto countFncSlots = [&](ParseNode *pnodeFnc)
    {
        if (pnodeFnc->AsParseNodeFnc()->GetFuncSymbol() != nullptr && pnodeFnc->AsParseNodeFnc()->IsDeclaration())
        {
            slotCount++;
        }
    };
    MapContainerScopeFunctions(pnodeParent, countFncSlots);

    if (slotCount == 0)
    {
        return;
    }

    size_t extraBytesActual = AllocSizeMath::Mul(slotCount, sizeof(Js::FuncInfoEntry));
    // Reg2Aux takes int for byteCount so we need to convert to int. OOM if we can't because it would truncate data.
    if (extraBytesActual > INT_MAX)
    {
        Js::Throw::OutOfMemory();
    }
    int extraBytes = (int)extraBytesActual;

    Js::FuncInfoArray *info = AnewPlus(alloc, extraBytes, Js::FuncInfoArray, slotCount);

    // slotCount is guaranteed to be non-zero here.
    Js::AuxArray<uint32> * slotIdInCachedScopeToNestedIndexArray = funcInfoParent->GetParsedFunctionBody()->AllocateSlotIdInCachedScopeToNestedIndexArray(slotCount);

    slotCount = 0;

    auto fillEntries = [&](ParseNode *pnodeFnc)
    {
        Symbol *sym = pnodeFnc->AsParseNodeFnc()->GetFuncSymbol();
        if (sym != nullptr && (pnodeFnc->AsParseNodeFnc()->IsDeclaration() || pnodeFnc->AsParseNodeFnc()->IsDefaultModuleExport()))
        {
            AssertMsg(!pnodeFnc->AsParseNodeFnc()->IsGenerator(), "Generator functions are not supported by InitCachedFuncs but since they always escape they should disable function caching");
            Js::FuncInfoEntry *entry = &info->elements[slotCount];
            entry->nestedIndex = pnodeFnc->AsParseNodeFnc()->nestedIndex;
            entry->scopeSlot = sym->GetScopeSlot();

            slotIdInCachedScopeToNestedIndexArray->elements[slotCount] = pnodeFnc->AsParseNodeFnc()->nestedIndex;
            slotCount++;
        }
    };
    MapContainerScopeFunctions(pnodeParent, fillEntries);

    m_writer.AuxNoReg(Js::OpCode::InitCachedFuncs,
        info,
        sizeof(Js::FuncInfoArray) + extraBytes,
        sizeof(Js::FuncInfoArray) + extraBytes);

    slotCount = 0;
    auto defineOrGetCachedFunc = [&](ParseNode *pnodeFnc)
    {
        Symbol *sym = pnodeFnc->AsParseNodeFnc()->GetFuncSymbol();
        if (pnodeFnc->AsParseNodeFnc()->IsDeclaration())
        {
            // Do we need to define the function here (i.e., is it not one of our cached locals)?
            // Only happens if the sym is null (e.g., function x.y(){}).
            if (sym == nullptr)
            {
                this->DefineOneFunction(pnodeFnc->AsParseNodeFnc(), funcInfoParent);
            }
            else if (!sym->IsInSlot(this, funcInfoParent) && sym->GetLocation() != Js::Constants::NoRegister)
            {
                // If it was defined by InitCachedFuncs, do we need to put it in a register rather than a slot?
                m_writer.Reg1Unsigned1(Js::OpCode::GetCachedFunc, sym->GetLocation(), slotCount);
            }
            // The "x = function() {...}" case is being generated on the fly, during emission,
            // so the caller expects to be able to release this register.
            funcInfoParent->ReleaseLoc(pnodeFnc);
            pnodeFnc->location = Js::Constants::NoRegister;
            slotCount++;
        }
    };
    MapContainerScopeFunctions(pnodeParent, defineOrGetCachedFunc);

    AdeletePlus(alloc, extraBytes, info);
}